

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O0

hash_table_t * hash_table_new(int32 size,int32 casearg)

{
  int32 iVar1;
  hash_table_t *phVar2;
  hash_entry_t *phVar3;
  hash_table_t *h;
  int32 casearg_local;
  int32 size_local;
  
  phVar2 = (hash_table_t *)
           __ckd_calloc__(1,0x18,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/hash_table.c"
                          ,0xa2);
  iVar1 = prime_size(size + (size >> 1));
  phVar2->size = iVar1;
  phVar2->nocase = (uint)(casearg == 1);
  phVar3 = (hash_entry_t *)
           __ckd_calloc__((long)phVar2->size,0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/hash_table.c"
                          ,0xa5);
  phVar2->table = phVar3;
  return phVar2;
}

Assistant:

hash_table_t *
hash_table_new(int32 size, int32 casearg)
{
    hash_table_t *h;

    h = (hash_table_t *) ckd_calloc(1, sizeof(hash_table_t));
    h->size = prime_size(size + (size >> 1));
    h->nocase = (casearg == HASH_CASE_NO);
    h->table = (hash_entry_t *) ckd_calloc(h->size, sizeof(hash_entry_t));
    /* The above calloc clears h->table[*].key and .next to NULL, i.e. an empty table */

    return h;
}